

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DestroySurface::DestroySurface
          (DestroySurface *this,EGLDisplay display,
          SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface)

{
  SharedPtr<tcu::ThreadUtil::Object> local_40 [2];
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *local_20;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface_local;
  EGLDisplay display_local;
  DestroySurface *this_local;
  
  local_20 = surface;
  surface_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)display;
  display_local = this;
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"DestroySurface");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__DestroySurface_00670000;
  this->m_display = surface_local;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&this->m_surface,surface);
  de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>
            (local_40,&this->m_surface);
  tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,local_40);
  de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(local_40);
  return;
}

Assistant:

DestroySurface::DestroySurface (EGLDisplay display, SharedPtr<Surface> surface)
	: tcu::ThreadUtil::Operation	("DestroySurface")
	, m_display					(display)
	, m_surface					(surface)
{
	modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_surface));
}